

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.h
# Opt level: O2

void __thiscall
CNetAddr::
UnserializeV2Stream<ParamsStream<ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>&,CNetAddr::SerParams>>
          (CNetAddr *this,
          ParamsStream<ParamsStream<HashVerifier<DataStream>_&,_CAddress::SerParams>_&,_CNetAddr::SerParams>
          *s)

{
  uint uVar1;
  char *pcVar2;
  uint uVar3;
  uint8_t possible_bip155_net;
  bool bVar4;
  CNetAddr *pCVar5;
  string *psVar6;
  unsigned_long *in_R8;
  long in_FS_OFFSET;
  size_t address_size;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  possible_bip155_net =
       ser_readdata8<ParamsStream<ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>&,CNetAddr::SerParams>>
                 (s);
  local_48._M_dataplus._M_p = (pointer)&address_size;
  Wrapper<CompactSizeFormatter<true>,unsigned_long&>::
  Unserialize<ParamsStream<ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>&,CNetAddr::SerParams>>
            ((Wrapper<CompactSizeFormatter<true>,unsigned_long&> *)&local_48,s);
  if (0x200 < address_size) {
    psVar6 = (string *)__cxa_allocate_exception(0x20);
    tinyformat::format<unsigned_long,unsigned_long>
              (&local_48,(tinyformat *)"Address too long: %u > %u",(char *)&address_size,
               &MAX_ADDRV2_SIZE,in_R8);
    std::ios_base::failure[abi:cxx11]::failure(psVar6);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(psVar6,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
    goto LAB_006b7296;
  }
  this->m_scope_id = 0;
  bVar4 = SetNetFromBIP155Network(this,possible_bip155_net,address_size);
  if (bVar4) {
    prevector<16U,_unsigned_char,_unsigned_int,_int>::resize(&this->m_addr,(size_type)address_size);
    uVar1 = (this->m_addr)._size;
    local_48._M_dataplus._M_p = (pointer)(this->m_addr)._union.indirect_contents.indirect;
    if (uVar1 < 0x11) {
      local_48._M_dataplus._M_p = (pointer)this;
    }
    uVar3 = uVar1 - 0x11;
    if (uVar1 < 0x11) {
      uVar3 = uVar1;
    }
    local_48._M_string_length = (size_type)uVar3;
    ParamsStream<ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>&,CNetAddr::SerParams>::
    operator>>((ParamsStream<ParamsStream<HashVerifier<DataStream>&,CAddress::SerParams>&,CNetAddr::SerParams>
                *)s,(Span<unsigned_char> *)&local_48);
    if (this->m_net == NET_IPV6) {
      bVar4 = util::HasPrefix<prevector<16u,unsigned_char,unsigned_int,int>,6ul>
                        (&this->m_addr,&INTERNAL_IN_IPV6_PREFIX);
      if (bVar4) {
        this->m_net = NET_INTERNAL;
        pCVar5 = this;
        if (0x10 < (this->m_addr)._size) {
          pCVar5 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
        }
        pcVar2 = *(char **)((long)&(pCVar5->m_addr)._union.indirect_contents.indirect + 6);
        *(undefined2 *)((long)&(pCVar5->m_addr)._union + 8) =
             *(undefined2 *)((long)&(pCVar5->m_addr)._union + 0xe);
        (pCVar5->m_addr)._union.indirect_contents.indirect = pcVar2;
        prevector<16U,_unsigned_char,_unsigned_int,_int>::resize(&this->m_addr,10);
      }
      else {
        bVar4 = util::HasPrefix<prevector<16u,unsigned_char,unsigned_int,int>,12ul>
                          (&this->m_addr,&IPV4_IN_IPV6_PREFIX);
        if ((bVar4) ||
           (bVar4 = util::HasPrefix<prevector<16u,unsigned_char,unsigned_int,int>,6ul>
                              (&this->m_addr,&TORV2_IN_IPV6_PREFIX), bVar4)) goto LAB_006b7196;
      }
    }
  }
  else {
    ParamsStream<ParamsStream<HashVerifier<DataStream>_&,_CAddress::SerParams>_&,_CNetAddr::SerParams>
    ::ignore(s,address_size);
LAB_006b7196:
    this->m_net = NET_IPV6;
    local_48._M_dataplus._M_p = local_48._M_dataplus._M_p & 0xffffffffffffff00;
    prevector<16U,_unsigned_char,_unsigned_int,_int>::assign(&this->m_addr,0x10,(uchar *)&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_006b7296:
  __stack_chk_fail();
}

Assistant:

void UnserializeV2Stream(Stream& s)
    {
        uint8_t bip155_net;
        s >> bip155_net;

        size_t address_size;
        s >> COMPACTSIZE(address_size);

        if (address_size > MAX_ADDRV2_SIZE) {
            throw std::ios_base::failure(strprintf(
                "Address too long: %u > %u", address_size, MAX_ADDRV2_SIZE));
        }

        m_scope_id = 0;

        if (SetNetFromBIP155Network(bip155_net, address_size)) {
            m_addr.resize(address_size);
            s >> Span{m_addr};

            if (m_net != NET_IPV6) {
                return;
            }

            // Do some special checks on IPv6 addresses.

            // Recognize NET_INTERNAL embedded in IPv6, such addresses are not
            // gossiped but could be coming from addrman, when unserializing from
            // disk.
            if (util::HasPrefix(m_addr, INTERNAL_IN_IPV6_PREFIX)) {
                m_net = NET_INTERNAL;
                memmove(m_addr.data(), m_addr.data() + INTERNAL_IN_IPV6_PREFIX.size(),
                        ADDR_INTERNAL_SIZE);
                m_addr.resize(ADDR_INTERNAL_SIZE);
                return;
            }

            if (!util::HasPrefix(m_addr, IPV4_IN_IPV6_PREFIX) &&
                !util::HasPrefix(m_addr, TORV2_IN_IPV6_PREFIX)) {
                return;
            }

            // IPv4 and TORv2 are not supposed to be embedded in IPv6 (like in V1
            // encoding). Unserialize as !IsValid(), thus ignoring them.
        } else {
            // If we receive an unknown BIP155 network id (from the future?) then
            // ignore the address - unserialize as !IsValid().
            s.ignore(address_size);
        }

        // Mimic a default-constructed CNetAddr object which is !IsValid() and thus
        // will not be gossiped, but continue reading next addresses from the stream.
        m_net = NET_IPV6;
        m_addr.assign(ADDR_IPV6_SIZE, 0x0);
    }